

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::AsyncStreamFd::~AsyncStreamFd(AsyncStreamFd *this)

{
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_0059bf18;
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&DAT_0059bfe8;
  kj::_::NullableValue<kj::Function<void_(kj::ArrayPtr<kj::AncillaryMessage>)>_>::~NullableValue
            (&(this->ancillaryMsgCallback).ptr);
  kj::_::NullableValue<kj::ForkedPromise<void>_>::~NullableValue
            (&(this->writeDisconnectedPromise).ptr);
  UnixEventPort::FdObserver::~FdObserver(&this->observer);
  AsyncIoStream::~AsyncIoStream((AsyncIoStream *)this);
  OwnedFileDescriptor::~OwnedFileDescriptor(&this->super_OwnedFileDescriptor);
  return;
}

Assistant:

virtual ~AsyncStreamFd() noexcept(false) {}